

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexEnumeratorBase.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
          (JavascriptArrayIndexEnumeratorBase *this,JavascriptArray *arrayObject,
          EnumeratorFlags flags,ScriptContext *scriptContext)

{
  JavascriptEnumerator::JavascriptEnumerator(&this->super_JavascriptEnumerator,scriptContext);
  (this->super_JavascriptEnumerator).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0150e268;
  Memory::Recycler::WBSetBit((char *)&this->arrayObject);
  (this->arrayObject).ptr = arrayObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->arrayObject);
  this->flags = flags;
  return;
}

Assistant:

JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptEnumerator(scriptContext),
        arrayObject(arrayObject),
        flags(flags)
    {
    }